

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaselineComparison.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  double dVar1;
  pointer pcVar2;
  Count true_triangle_count;
  pointer pbVar3;
  ErrorCode EVar4;
  uint uVar5;
  int iVar6;
  ostream *poVar7;
  ulong uVar8;
  size_t __i;
  long lVar9;
  pointer piVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  ulong uVar12;
  _Alloc_hider _Var13;
  pointer pbVar14;
  CGraph cg;
  VertexIdx seed;
  Parameters params;
  config_params cfp;
  uniform_int_distribution<long> dist_seed_vertex;
  mt19937 mt;
  random_device rd;
  double *local_2d40;
  CGraph local_2d38;
  long *local_2d18 [2];
  long local_2d08 [2];
  undefined1 local_2cf8 [40];
  long *local_2cd0;
  iterator local_2cc8;
  long *local_2cc0;
  long local_2cb8;
  long local_2cb0;
  int local_2ca8;
  double local_2ca0;
  _Alloc_hider local_2c98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c88;
  _Alloc_hider local_2c78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c68;
  bool local_2c58;
  bool bStack_2c57;
  bool local_2c56;
  bool local_2c55;
  bool bStack_2c54;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2c50;
  double *local_2c48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2c40;
  int *local_2c38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2c30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2c28;
  int *local_2c20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2c18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2c10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2c08;
  config_params local_2c00;
  uniform_int_distribution<long> local_2b50;
  Parameters local_2b40;
  Parameters local_2a98;
  Parameters local_29f0;
  Parameters local_2948;
  Parameters local_28a0;
  Parameters local_27f8;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_2740;
  random_device local_13b8;
  
  if (argc == 2) {
    LoadConfig(&local_2c00,argv[1]);
    if (local_2c00.input_files.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_2c00.input_files.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      local_2c40 = &local_2a98.out_directory.field_2;
      local_2c30 = &local_29f0.out_directory.field_2;
      local_2c28 = &local_2948.out_directory.field_2;
      local_2c18 = &local_28a0.out_directory.field_2;
      local_2c10 = &local_27f8.out_directory.field_2;
      local_2c08 = &local_2b40.out_directory.field_2;
      local_2c50 = &local_2c68;
      uVar12 = 0;
      do {
        std::chrono::_V2::system_clock::now();
        EVar4 = Escape::loadGraphCSR
                          (local_2c00.input_files.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar12]._M_dataplus._M_p,
                           &local_2d38,1);
        if (EVar4 != ecNone) {
          exit(1);
        }
        std::chrono::_V2::system_clock::now();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Time to load graph = ",0x15);
        poVar7 = std::ostream::_M_insert<long>((long)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," seconds",8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"#Graph name : ",0xe);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,
                            local_2c00.input_files.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar12]._M_dataplus._M_p,
                            local_2c00.input_files.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar12]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"#Vertices = ",0xc);
        poVar7 = std::ostream::_M_insert<long>((long)poVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,",#Edges = ",10);
        poVar7 = std::ostream::_M_insert<long>((long)poVar7);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        Parameters::Parameters((Parameters *)local_2cf8);
        std::__cxx11::string::_M_assign((string *)local_2cf8);
        local_2ca8 = local_2c00.no_of_repeats;
        local_2c58 = local_2c00.print_to_console;
        bStack_2c57 = local_2c00.print_to_file;
        std::__cxx11::string::_M_assign((string *)&local_2c78);
        local_2c56 = local_2c00.edge_count_available;
        std::random_device::random_device(&local_13b8);
        uVar5 = std::random_device::_M_getval();
        local_2740._M_x[0] = (unsigned_long)uVar5;
        lVar9 = 1;
        uVar8 = local_2740._M_x[0];
        do {
          uVar8 = (ulong)(((uint)(uVar8 >> 0x1e) ^ (uint)uVar8) * 0x6c078965 + (int)lVar9);
          local_2740._M_x[lVar9] = uVar8;
          lVar9 = lVar9 + 1;
        } while (lVar9 != 0x270);
        local_2740._M_p = 0x270;
        local_2d40 = local_2c00.sparsification_prob.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
        local_2c48 = local_2c00.sparsification_prob.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish;
        if (local_2c00.sparsification_prob.super__Vector_base<double,_std::allocator<double>_>.
            _M_impl.super__Vector_impl_data._M_start !=
            local_2c00.sparsification_prob.super__Vector_base<double,_std::allocator<double>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          do {
            local_2c38 = local_2c00.seed_count.super__Vector_base<int,_std::allocator<int>_>._M_impl
                         .super__Vector_impl_data._M_finish;
            if (local_2c00.seed_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start !=
                local_2c00.seed_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              dVar1 = *local_2d40;
              piVar10 = local_2c00.seed_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              do {
                local_2cf8._32_8_ = SEXT48(*piVar10);
                if (local_2cc8._M_current != local_2cd0) {
                  local_2cc8._M_current = local_2cd0;
                }
                local_2b50._M_param._M_b = local_2d38.nVertices + -1;
                local_2b50._M_param._M_a = 0;
                pbVar14 = local_2c00.algo_names.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                local_2c20 = piVar10;
                pbVar3 = local_2c00.algo_names.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                if (0 < (long)local_2cf8._32_8_) {
                  lVar9 = 0;
                  do {
                    local_2d18[0] =
                         (long *)std::uniform_int_distribution<long>::operator()
                                           (&local_2b50,&local_2740,&local_2b50._M_param);
                    if (local_2cc8._M_current == local_2cc0) {
                      std::vector<long,std::allocator<long>>::_M_realloc_insert<long&>
                                ((vector<long,std::allocator<long>> *)&local_2cd0,local_2cc8,
                                 (long *)local_2d18);
                    }
                    else {
                      *local_2cc8._M_current = (long)local_2d18[0];
                      local_2cc8._M_current = local_2cc8._M_current + 1;
                    }
                    lVar9 = lVar9 + 1;
                    pbVar14 = local_2c00.algo_names.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    pbVar3 = local_2c00.algo_names.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  } while (lVar9 < (long)local_2cf8._32_8_);
                }
                for (; pbVar14 != pbVar3; pbVar14 = pbVar14 + 1) {
                  local_2d18[0] = local_2d08;
                  pcVar2 = (pbVar14->_M_dataplus)._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)local_2d18,pcVar2,pcVar2 + pbVar14->_M_string_length);
                  std::__cxx11::string::_M_assign((string *)&local_2c98);
                  local_2cb8 = (long)((double)local_2d38.nEdges * dVar1);
                  local_2cb0 = (long)((double)local_2cb8 * local_2c00.subsample_prob);
                  true_triangle_count =
                       local_2c00.triangle_count.
                       super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar12];
                  local_2ca0 = dVar1;
                  iVar6 = std::__cxx11::string::compare((char *)local_2d18);
                  if (iVar6 == 0) {
                    Parameters::Parameters(&local_2b40,(Parameters *)local_2cf8);
                    TriangleEstimator<Estimates(*)(Escape::CGraph*,Parameters)>
                              (&local_2d38,&local_2b40,true_triangle_count,TETRIS);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2b40.out_directory._M_dataplus._M_p != local_2c08) {
                      operator_delete(local_2b40.out_directory._M_dataplus._M_p,
                                      local_2b40.out_directory.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2b40.algo_name._M_dataplus._M_p != &local_2b40.algo_name.field_2) {
                      operator_delete(local_2b40.algo_name._M_dataplus._M_p,
                                      local_2b40.algo_name.field_2._M_allocated_capacity + 1);
                    }
                    if (local_2b40.seed_vertices.super__Vector_base<long,_std::allocator<long>_>.
                        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_2b40.seed_vertices.
                                      super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                      super__Vector_impl_data._M_start,
                                      (long)local_2b40.seed_vertices.
                                            super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                            super__Vector_impl_data._M_end_of_storage -
                                      (long)local_2b40.seed_vertices.
                                            super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                            super__Vector_impl_data._M_start);
                    }
                    paVar11 = &local_2b40.filename.field_2;
                    _Var13._M_p = local_2b40.filename._M_dataplus._M_p;
LAB_0010f565:
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)_Var13._M_p != paVar11) {
                      operator_delete(_Var13._M_p,paVar11->_M_allocated_capacity + 1);
                    }
                  }
                  else {
                    iVar6 = std::__cxx11::string::compare((char *)local_2d18);
                    if (iVar6 == 0) {
                      local_2cb8 = (long)(double)((local_2cb8 * 0x16) / 0x50);
                      Parameters::Parameters(&local_27f8,(Parameters *)local_2cf8);
                      TriangleEstimator<Estimates(*)(Escape::CGraph*,Parameters)>
                                (&local_2d38,&local_27f8,true_triangle_count,VertexMCMC);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_27f8.out_directory._M_dataplus._M_p != local_2c10) {
                        operator_delete(local_27f8.out_directory._M_dataplus._M_p,
                                        local_27f8.out_directory.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_27f8.algo_name._M_dataplus._M_p != &local_27f8.algo_name.field_2)
                      {
                        operator_delete(local_27f8.algo_name._M_dataplus._M_p,
                                        local_27f8.algo_name.field_2._M_allocated_capacity + 1);
                      }
                      if (local_27f8.seed_vertices.super__Vector_base<long,_std::allocator<long>_>.
                          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                        operator_delete(local_27f8.seed_vertices.
                                        super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                        super__Vector_impl_data._M_start,
                                        (long)local_27f8.seed_vertices.
                                              super__Vector_base<long,_std::allocator<long>_>.
                                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)local_27f8.seed_vertices.
                                              super__Vector_base<long,_std::allocator<long>_>.
                                              _M_impl.super__Vector_impl_data._M_start);
                      }
                      paVar11 = &local_27f8.filename.field_2;
                      _Var13._M_p = local_27f8.filename._M_dataplus._M_p;
                      goto LAB_0010f565;
                    }
                    iVar6 = std::__cxx11::string::compare((char *)local_2d18);
                    if (iVar6 == 0) {
                      local_2cb8 = (long)(double)((local_2cb8 * 0x16) / 0x28);
                      local_2c55 = local_2c00.CSS;
                      bStack_2c54 = local_2c00.NB;
                      Parameters::Parameters(&local_28a0,(Parameters *)local_2cf8);
                      TriangleEstimator<Estimates(*)(Escape::CGraph*,Parameters)>
                                (&local_2d38,&local_28a0,true_triangle_count,SRW1);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_28a0.out_directory._M_dataplus._M_p != local_2c18) {
                        operator_delete(local_28a0.out_directory._M_dataplus._M_p,
                                        local_28a0.out_directory.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_28a0.algo_name._M_dataplus._M_p != &local_28a0.algo_name.field_2)
                      {
                        operator_delete(local_28a0.algo_name._M_dataplus._M_p,
                                        local_28a0.algo_name.field_2._M_allocated_capacity + 1);
                      }
                      if (local_28a0.seed_vertices.super__Vector_base<long,_std::allocator<long>_>.
                          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                        operator_delete(local_28a0.seed_vertices.
                                        super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                        super__Vector_impl_data._M_start,
                                        (long)local_28a0.seed_vertices.
                                              super__Vector_base<long,_std::allocator<long>_>.
                                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)local_28a0.seed_vertices.
                                              super__Vector_base<long,_std::allocator<long>_>.
                                              _M_impl.super__Vector_impl_data._M_start);
                      }
                      paVar11 = &local_28a0.filename.field_2;
                      _Var13._M_p = local_28a0.filename._M_dataplus._M_p;
                      goto LAB_0010f565;
                    }
                    iVar6 = std::__cxx11::string::compare((char *)local_2d18);
                    if (iVar6 == 0) {
                      local_2cb8 = (long)(double)((local_2cb8 * 2) / 3);
                      Parameters::Parameters(&local_2948,(Parameters *)local_2cf8);
                      TriangleEstimator<Estimates(*)(Escape::CGraph*,Parameters)>
                                (&local_2d38,&local_2948,true_triangle_count,SERWC);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_2948.out_directory._M_dataplus._M_p != local_2c28) {
                        operator_delete(local_2948.out_directory._M_dataplus._M_p,
                                        local_2948.out_directory.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_2948.algo_name._M_dataplus._M_p != &local_2948.algo_name.field_2)
                      {
                        operator_delete(local_2948.algo_name._M_dataplus._M_p,
                                        local_2948.algo_name.field_2._M_allocated_capacity + 1);
                      }
                      if (local_2948.seed_vertices.super__Vector_base<long,_std::allocator<long>_>.
                          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                        operator_delete(local_2948.seed_vertices.
                                        super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                        super__Vector_impl_data._M_start,
                                        (long)local_2948.seed_vertices.
                                              super__Vector_base<long,_std::allocator<long>_>.
                                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)local_2948.seed_vertices.
                                              super__Vector_base<long,_std::allocator<long>_>.
                                              _M_impl.super__Vector_impl_data._M_start);
                      }
                      paVar11 = &local_2948.filename.field_2;
                      _Var13._M_p = local_2948.filename._M_dataplus._M_p;
                      goto LAB_0010f565;
                    }
                    iVar6 = std::__cxx11::string::compare((char *)local_2d18);
                    if (iVar6 == 0) {
                      local_2cb8 = (long)(double)((local_2cb8 * 2) / 3);
                      Parameters::Parameters(&local_29f0,(Parameters *)local_2cf8);
                      TriangleEstimator<Estimates(*)(Escape::CGraph*,Parameters)>
                                (&local_2d38,&local_29f0,true_triangle_count,SEC);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_29f0.out_directory._M_dataplus._M_p != local_2c30) {
                        operator_delete(local_29f0.out_directory._M_dataplus._M_p,
                                        local_29f0.out_directory.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_29f0.algo_name._M_dataplus._M_p != &local_29f0.algo_name.field_2)
                      {
                        operator_delete(local_29f0.algo_name._M_dataplus._M_p,
                                        local_29f0.algo_name.field_2._M_allocated_capacity + 1);
                      }
                      if (local_29f0.seed_vertices.super__Vector_base<long,_std::allocator<long>_>.
                          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                        operator_delete(local_29f0.seed_vertices.
                                        super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                        super__Vector_impl_data._M_start,
                                        (long)local_29f0.seed_vertices.
                                              super__Vector_base<long,_std::allocator<long>_>.
                                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)local_29f0.seed_vertices.
                                              super__Vector_base<long,_std::allocator<long>_>.
                                              _M_impl.super__Vector_impl_data._M_start);
                      }
                      paVar11 = &local_29f0.filename.field_2;
                      _Var13._M_p = local_29f0.filename._M_dataplus._M_p;
                      goto LAB_0010f565;
                    }
                    iVar6 = std::__cxx11::string::compare((char *)local_2d18);
                    if (iVar6 == 0) {
                      local_2cb8 = (long)(double)local_2cb8;
                      Parameters::Parameters(&local_2a98,(Parameters *)local_2cf8);
                      TriangleEstimator<Estimates(*)(Escape::CGraph*,Parameters)>
                                (&local_2d38,&local_2a98,true_triangle_count,UESS);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_2a98.out_directory._M_dataplus._M_p != local_2c40) {
                        operator_delete(local_2a98.out_directory._M_dataplus._M_p,
                                        local_2a98.out_directory.field_2._M_allocated_capacity + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_2a98.algo_name._M_dataplus._M_p != &local_2a98.algo_name.field_2)
                      {
                        operator_delete(local_2a98.algo_name._M_dataplus._M_p,
                                        local_2a98.algo_name.field_2._M_allocated_capacity + 1);
                      }
                      if (local_2a98.seed_vertices.super__Vector_base<long,_std::allocator<long>_>.
                          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                        operator_delete(local_2a98.seed_vertices.
                                        super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                        super__Vector_impl_data._M_start,
                                        (long)local_2a98.seed_vertices.
                                              super__Vector_base<long,_std::allocator<long>_>.
                                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)local_2a98.seed_vertices.
                                              super__Vector_base<long,_std::allocator<long>_>.
                                              _M_impl.super__Vector_impl_data._M_start);
                      }
                      paVar11 = &local_2a98.filename.field_2;
                      _Var13._M_p = local_2a98.filename._M_dataplus._M_p;
                      goto LAB_0010f565;
                    }
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"Unknown algorithm option. \n",0x1b);
                  }
                  if (local_2d18[0] != local_2d08) {
                    operator_delete(local_2d18[0],local_2d08[0] + 1);
                  }
                }
                piVar10 = local_2c20 + 1;
              } while (piVar10 != local_2c38);
            }
            local_2d40 = local_2d40 + 1;
          } while (local_2d40 != local_2c48);
        }
        std::random_device::_M_fini();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c78._M_p != local_2c50) {
          operator_delete(local_2c78._M_p,local_2c68._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c98._M_p != &local_2c88) {
          operator_delete(local_2c98._M_p,local_2c88._M_allocated_capacity + 1);
        }
        if (local_2cd0 != (long *)0x0) {
          operator_delete(local_2cd0,(long)local_2cc0 - (long)local_2cd0);
        }
        if ((undefined1 *)local_2cf8._0_8_ != local_2cf8 + 0x10) {
          operator_delete((void *)local_2cf8._0_8_,local_2cf8._16_8_ + 1);
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 < (ulong)((long)local_2c00.input_files.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_2c00.input_files.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2c00.out_directory._M_dataplus._M_p != &local_2c00.out_directory.field_2) {
      operator_delete(local_2c00.out_directory._M_dataplus._M_p,
                      local_2c00.out_directory.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2c00.algo_names);
    if (local_2c00.seed_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start != (int *)0x0) {
      operator_delete(local_2c00.seed_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2c00.seed_count.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_2c00.seed_count.super__Vector_base<int,_std::allocator<int>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_2c00.sparsification_prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (double *)0x0) {
      operator_delete(local_2c00.sparsification_prob.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2c00.sparsification_prob.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2c00.sparsification_prob.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_2c00.triangle_count.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2c00.triangle_count.
                      super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2c00.triangle_count.
                            super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2c00.triangle_count.
                            super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2c00.input_files);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Usage File: ./SubgraphCount script_file\n\n",0x29);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {

    CGraph cg;
    if (argc != 2) {
        std::cout << "Usage File: ./SubgraphCount script_file\n\n";
        return 0;
    }
    config_params cfp = LoadConfig(argv[1]);

    for (int i = 0; i < cfp.input_files.size(); i++) {
        /**
         * Load the input graph and print relevant parameters
         */
        auto startTime = std::chrono::high_resolution_clock::now();
        if (loadGraphCSR(cfp.input_files[i].c_str(), cg, 1))
            exit(1);
        auto endTime = std::chrono::high_resolution_clock::now();
        std::cout << "Time to load graph = " <<
                  std::chrono::duration_cast<std::chrono::seconds>(endTime - startTime).count()
                  << " seconds" << std::endl;
        std::cout << "#Graph name : " << cfp.input_files[i] << "#Vertices = " << cg.nVertices << ",#Edges = " << cg.nEdges << std::endl;

        /**
         * Load relevant parameters
         */
        Parameters params;
        params.filename = cfp.input_files[i];
        params.no_of_repeat = cfp.no_of_repeats;
        params.print_to_console = cfp.print_to_console;
        params.print_to_file = cfp.print_to_file;
        params.out_directory = cfp.out_directory;
        params.normalization_count_available = cfp.edge_count_available;

        /**
         * Set up randomness initiator
         */
        std::random_device rd;
        std::mt19937 mt(rd());

        /**
         * For each sprisification parameter and seed count and algo_name,
         * run an instance
         */
        for (auto sparsification_prob : cfp.sparsification_prob) {
            for (auto seed_count: cfp.seed_count) {

                params.seed_count = seed_count;
                params.seed_vertices.clear();

                /**
                 * We fix the seed vertices and run for params.no_of_repeat many iterations with the
                 * seed vertex remaining fixed.
                 * We just need to
                 * sample uniform random seed vertex from the entire graph.
                 * THIS IS THE NORMAL MODE IN WHICH ALL BASELINE AND OUR
                 * ALGORITHMS ARE EXECUTED
                 */
                VertexIdx n = cg.nVertices;
                std::uniform_int_distribution<VertexIdx> dist_seed_vertex(0, n - 1);
                for (VertexIdx sC = 0; sC < params.seed_count; sC++) {
                    VertexIdx seed = dist_seed_vertex(mt); // TODO: verify randomness
                    params.seed_vertices.emplace_back(seed);
                }

                for (auto algo_name : cfp.algo_names) {
                    /**
                     * Update parameters for this particular run
                     */
                    params.algo_name = algo_name;
                    params.sparsification_prob = sparsification_prob;
                    params.walk_length = cg.nEdges * sparsification_prob; // g.nEdges is twice the number of edges
                    params.subsample_size = params.walk_length * cfp.subsample_prob;
                    EdgeIdx triangle_count = cfp.triangle_count[i];

                    if (algo_name == "TETRIS") {                     // Our Algorithm
                        TriangleEstimator(&cg, params, triangle_count, TETRIS);
                    } else if (algo_name == "VertexMCMC") {
                        // Vertex MCMC sees about 2.5 time more of the edges for same walk length. For comparsion, we adjust the walk length accordingly.
                        params.walk_length = floor(params.walk_length *22 / 80);
                        TriangleEstimator(&cg, params, triangle_count, VertexMCMC);
                    }
                    else if (algo_name == "SRW1") {
                        params.walk_length = floor(params.walk_length * 22 / 40);
                        params.CSS = cfp.CSS;
                        params.NB = cfp.NB;
                        TriangleEstimator(&cg, params, triangle_count, SRW1);
                    }
                    else if (algo_name == "SERWC") { // Baseline:  do a random walk and count the number of triangles incident on each edge. Then scale.
                        params.walk_length = floor(params.walk_length * 2 / 3);
                        TriangleEstimator(&cg, params, triangle_count, SERWC);
                    }
                    else if (algo_name == "SEC") { // Baseline:  do a random walk and count the number of triangles incident on each edge. Then scale.
                        params.walk_length = floor(params.walk_length *2/3);
                        TriangleEstimator(&cg, params, triangle_count, SEC);
                    }
                    else if (algo_name == "UESS") { // Baseline:  do a random walk and count the number of triangles incident on each edge. Then scale.
                        params.walk_length = floor(params.walk_length);
                        TriangleEstimator(&cg, params, triangle_count, UESS);
                    }
                    else
                        std::cout << "Unknown algorithm option. \n";
//                            // Baseline: sample an edge and count the number of triangles incident on it. Then scale.
//                        else if (algo_name == "EstTriByEdgeSampleAndCount")
//                            TriangleEstimator(&cg, params, triangle_count, EstTriByEdgeSampleAndCount);
//                            // Baseline: do a random walk and count the teiangles in induces multi-graph. Scale.
//                        else if (algo_name == "EstTriByRW")
//                            TriangleEstimator(&cg, params, triangle_count, EstTriByRW);
//                            // Sample an edge, sample a neighbor and estimate the teiangles incident on the neighbor. Scale up.
//                        else if (algo_name == "EstTriByRWandNborSampling")
//                            TriangleEstimator(&cg, params, triangle_count, EstTriByRWandNborSampling);
//                            // Sample each edge with probability p and count traingles in the subsampled graph. Scale by 1/p^3.
//                        else if (algo_name == "EstTriBySparsification")
//                            TriangleEstimator(&cg, params, triangle_count, EstTriBySparsification);
//                            // Uniformly Sample edges, and count the number of triangles in the multi-graph.
//                        else if (algo_name == "UESS")
//                            TriangleEstimator(&cg, params, triangle_count, UESS);
                }
            }

        }
    }
    return 0;
}